

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroker_inside(PVG_FT_Stroker stroker,PVG_FT_Int side,PVG_FT_Fixed line_length)

{
  long lVar1;
  bool bVar2;
  PVG_FT_Error PVar3;
  PVG_FT_StrokeBorder border_00;
  long lVar4;
  PVG_FT_Angle PVar5;
  long angle;
  PVG_FT_Pos PVar6;
  PVG_FT_Long PVar7;
  PVG_FT_Fixed min_length;
  undefined1 auStack_68 [3];
  PVG_FT_Bool intersect;
  PVG_FT_Error error;
  PVG_FT_Vector delta;
  PVG_FT_Vector sigma;
  PVG_FT_Fixed length;
  PVG_FT_Angle rotate;
  PVG_FT_Angle theta;
  PVG_FT_Angle phi;
  PVG_FT_StrokeBorder border;
  PVG_FT_Fixed line_length_local;
  PVG_FT_Int side_local;
  PVG_FT_Stroker stroker_local;
  
  border_00 = stroker->borders + side;
  memset(&delta.y,0,0x10);
  lVar4 = (long)side * -0xb40000 + 0x5a0000;
  PVar5 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  angle = PVar5 / 2;
  if ((((border_00->movable == '\0') || (line_length == 0)) || (0x59c000 < angle)) ||
     (angle < -0x59c000)) {
    bVar2 = false;
  }
  else {
    PVG_FT_Vector_Unit((PVG_FT_Vector *)&delta.y,angle);
    PVar7 = PVG_FT_MulDiv(stroker->radius,sigma.x,delta.y);
    PVar6 = ft_pos_abs(PVar7);
    bVar2 = false;
    if ((PVar6 != 0) && (bVar2 = false, PVar6 <= stroker->line_length)) {
      bVar2 = PVar6 <= line_length;
    }
  }
  if (bVar2) {
    lVar1 = stroker->angle_in;
    PVar7 = PVG_FT_DivFix(stroker->radius,delta.y);
    PVG_FT_Vector_From_Polar((PVG_FT_Vector *)auStack_68,PVar7,lVar1 + angle + lVar4);
    _auStack_68 = (stroker->center).x + _auStack_68;
    delta.x = (stroker->center).y + delta.x;
  }
  else {
    PVG_FT_Vector_From_Polar((PVG_FT_Vector *)auStack_68,stroker->radius,stroker->angle_out + lVar4)
    ;
    _auStack_68 = (stroker->center).x + _auStack_68;
    delta.x = (stroker->center).y + delta.x;
    border_00->movable = '\0';
  }
  PVar3 = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)auStack_68,'\0');
  return PVar3;
}

Assistant:

static PVG_FT_Error ft_stroker_inside(PVG_FT_Stroker stroker, PVG_FT_Int side,
                                     PVG_FT_Fixed line_length)
{
    PVG_FT_StrokeBorder border = stroker->borders + side;
    PVG_FT_Angle        phi, theta, rotate;
    PVG_FT_Fixed        length;
    PVG_FT_Vector       sigma = {0, 0};
    PVG_FT_Vector       delta;
    PVG_FT_Error        error = 0;
    PVG_FT_Bool         intersect; /* use intersection of lines? */

    rotate = PVG_FT_SIDE_TO_ROTATE(side);

    theta = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out) / 2;

    /* Only intersect borders if between two lineto's and both */
    /* lines are long enough (line_length is zero for curves). */
    if (!border->movable || line_length == 0  ||
         theta > 0x59C000 || theta < -0x59C000 )
        intersect = FALSE;
    else {
      /* compute minimum required length of lines */
      PVG_FT_Fixed  min_length;


      PVG_FT_Vector_Unit( &sigma, theta );
      min_length =
        ft_pos_abs( PVG_FT_MulDiv( stroker->radius, sigma.y, sigma.x ) );

      intersect = PVG_FT_BOOL( min_length                         &&
                           stroker->line_length >= min_length &&
                           line_length          >= min_length );
    }

    if (!intersect) {
        PVG_FT_Vector_From_Polar(&delta, stroker->radius,
                                stroker->angle_out + rotate);
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        border->movable = FALSE;
    } else {
        /* compute median angle */
        phi = stroker->angle_in + theta + rotate;

      length = PVG_FT_DivFix( stroker->radius, sigma.x );

      PVG_FT_Vector_From_Polar( &delta, length, phi );
      delta.x += stroker->center.x;
      delta.y += stroker->center.y;
    }

    error = ft_stroke_border_lineto(border, &delta, FALSE);

    return error;
}